

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O3

string * kaitai::kstream::bytes_strip_right
                   (string *__return_storage_ptr__,string *src,char pad_byte)

{
  long lVar1;
  size_type sVar2;
  
  sVar2 = src->_M_string_length;
  do {
    if (sVar2 == 0) break;
    lVar1 = sVar2 - 1;
    sVar2 = sVar2 - 1;
  } while ((src->_M_dataplus)._M_p[lVar1] == pad_byte);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)src);
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::bytes_strip_right(std::string src, char pad_byte) {
    std::size_t new_len = src.length();

    while (new_len > 0 && src[new_len - 1] == pad_byte)
        new_len--;

    return src.substr(0, new_len);
}